

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

handle pybind11::detail::
       list_caster<std::vector<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,std::allocator<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>>,std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
       ::
       cast<std::vector<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,std::allocator<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>>>
                 (vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                  *src,return_value_policy policy,handle parent)

{
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *puVar1;
  PyObject *tmp;
  handle hVar2;
  long lVar3;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *src_00;
  list l;
  object value_;
  handle local_40;
  object local_38;
  
  list::list((list *)&local_40,(*(long *)(src + 8) - *(long *)src >> 3) * 0x6db6db6db6db6db7);
  src_00 = *(unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> **)src
  ;
  puVar1 = *(unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> **)
            (src + 8);
  if (src_00 != puVar1) {
    lVar3 = 0;
    do {
      hVar2 = set_caster<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,long>
              ::
              cast<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
                        (src_00,policy,parent);
      if (hVar2.m_ptr == (PyObject *)0x0) {
        local_38.super_handle = hVar2;
        object::~object(&local_38);
        hVar2.m_ptr = (PyObject *)0x0;
        goto LAB_001caf8b;
      }
      local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
      *(PyObject **)((long)&((local_40.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar3) =
           hVar2.m_ptr;
      object::~object(&local_38);
      src_00 = src_00 + 1;
      lVar3 = lVar3 + 8;
    } while (src_00 != puVar1);
  }
  hVar2.m_ptr = local_40.m_ptr;
  local_40.m_ptr = (PyObject *)0x0;
LAB_001caf8b:
  object::~object((object *)&local_40);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }